

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O2

void rw::wdgl::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  RGBA RVar1;
  Geometry *pGVar2;
  code *pcVar3;
  AttribDesc *a;
  RGBA *pRVar4;
  undefined1 auVar5 [13];
  int iVar6;
  InstanceDataHeader *pIVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  uint32 uVar10;
  uint uVar11;
  uint32 *puVar12;
  long lVar13;
  int32 i;
  TexCoords *src;
  int iVar14;
  uint32 uVar15;
  V3d *pVVar16;
  int32 i_1;
  uint8 *puVar17;
  AttribDesc *a_00;
  undefined1 auVar18 [16];
  undefined1 local_48 [16];
  
  pGVar2 = atomic->geometry;
  if (pGVar2->instData == (InstanceDataHeader *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 330"
    ;
    pIVar7 = (InstanceDataHeader *)(*DAT_00145dd8)(0x28,0x3000f);
    pGVar2->instData = pIVar7;
    pIVar7->platform = 0xb;
    *(undefined8 *)(pIVar7 + 8) = 0;
    uVar10 = rwpipe[1].super_Pipeline.pluginID + (uint)(0 < pGVar2->numTexCoordSets) + 1;
    pIVar7[1].platform = uVar10;
    uVar11 = pGVar2->flags;
    uVar10 = (uVar11 >> 3 & 1) + uVar10 + (uint)((uVar11 >> 4 & 1) != 0);
    if ((uVar11 & 0x18) != 0) {
      pIVar7[1].platform = uVar10;
    }
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 342"
    ;
    puVar8 = (undefined8 *)(*DAT_00145dd8)((long)(int)uVar10 * 0x18,0x3000f);
    *(undefined8 **)(pIVar7 + 2) = puVar8;
    *puVar8 = 0;
    puVar8[1] = 0x300000000;
    *(undefined4 *)((long)puVar8 + 0x14) = 0;
    if (pGVar2->numTexCoordSets == 0) {
      puVar8 = puVar8 + 3;
      iVar14 = 1;
      uVar10 = 0xc;
    }
    else {
      puVar8[3] = 0x300000001;
      puVar8[4] = 0x200000000;
      *(undefined4 *)((long)puVar8 + 0x2c) = 0xc;
      puVar8 = puVar8 + 6;
      iVar14 = 2;
      uVar10 = 0x10;
    }
    uVar11 = pGVar2->flags;
    if ((uVar11 & 0x10) != 0) {
      *puVar8 = 0x100000002;
      puVar8[1] = 0x300000001;
      *(uint32 *)((long)puVar8 + 0x14) = uVar10;
      uVar10 = uVar10 + 4;
      puVar8 = puVar8 + 3;
      iVar14 = iVar14 + 1;
    }
    if ((uVar11 & 8) != 0) {
      *puVar8 = 0x200000003;
      puVar8[1] = 0x400000001;
      *(uint32 *)((long)puVar8 + 0x14) = uVar10;
      uVar10 = uVar10 + 4;
      iVar14 = iVar14 + 1;
    }
    pcVar3 = *(code **)&rwpipe[1].super_Pipeline.platform;
    if (pcVar3 == (code *)0x0) {
      uVar15 = pGVar2->numVertices * uVar10;
      pIVar7[4].platform = uVar15;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 393"
      ;
      uVar9 = (*DAT_00145dd8)(uVar15,0x3000f);
      *(undefined8 *)(pIVar7 + 6) = uVar9;
    }
    else {
      iVar14 = (*pcVar3)(pGVar2,iVar14,uVar10);
      uVar10 = uVar10 + iVar14;
    }
    a = *(AttribDesc **)(pIVar7 + 2);
    uVar15 = pIVar7[1].platform;
    puVar12 = &a->stride;
    for (lVar13 = 0; lVar13 < (int)uVar15; lVar13 = lVar13 + 1) {
      *puVar12 = uVar10;
      puVar12 = puVar12 + 6;
    }
    puVar17 = (uint8 *)((ulong)a->offset + *(long *)(pIVar7 + 6));
    pVVar16 = pGVar2->morphTargets->vertices;
    for (iVar14 = 0; iVar6 = pGVar2->numVertices, iVar14 < iVar6; iVar14 = iVar14 + 1) {
      packattrib(puVar17,&pVVar16->x,a,1.0);
      pVVar16 = pVVar16 + 1;
      puVar17 = puVar17 + a->stride;
    }
    a_00 = a + 1;
    if (pGVar2->numTexCoordSets != 0) {
      puVar17 = (uint8 *)((ulong)a[1].offset + *(long *)(pIVar7 + 6));
      src = pGVar2->texCoords[0];
      for (iVar14 = 0; iVar14 < iVar6; iVar14 = iVar14 + 1) {
        packattrib(puVar17,&src->u,a_00,512.0);
        src = src + 1;
        puVar17 = puVar17 + a[1].stride;
        iVar6 = pGVar2->numVertices;
      }
      a_00 = a + 2;
    }
    uVar11 = pGVar2->flags;
    if ((uVar11 & 0x10) != 0) {
      puVar17 = (uint8 *)((ulong)a_00->offset + *(long *)(pIVar7 + 6));
      pVVar16 = pGVar2->morphTargets->normals;
      for (iVar14 = 0; iVar14 < iVar6; iVar14 = iVar14 + 1) {
        packattrib(puVar17,&pVVar16->x,a_00,1.0);
        pVVar16 = pVVar16 + 1;
        puVar17 = puVar17 + a_00->stride;
        iVar6 = pGVar2->numVertices;
      }
      a_00 = a_00 + 1;
      uVar11 = pGVar2->flags;
    }
    if ((uVar11 & 8) != 0) {
      puVar17 = (uint8 *)((ulong)a_00->offset + *(long *)(pIVar7 + 6));
      pRVar4 = pGVar2->colors;
      for (lVar13 = 0; (int)lVar13 < iVar6; lVar13 = lVar13 + 1) {
        RVar1 = pRVar4[lVar13];
        auVar5[0xc] = RVar1.alpha;
        auVar5._0_12_ = ZEXT712(0);
        auVar18._0_4_ = (float)((uint)RVar1 & 0xff);
        auVar18._4_4_ = (float)((uint)RVar1 >> 8 & 0xff);
        auVar18._8_4_ = (float)(int)CONCAT32(auVar5._10_3_,(ushort)RVar1.blue);
        auVar18._12_4_ = (float)(uint3)(auVar5._10_3_ >> 0x10);
        local_48 = divps(auVar18,_DAT_001318e0);
        packattrib(puVar17,(float32 *)local_48,a_00,1.0);
        puVar17 = puVar17 + a_00->stride;
        iVar6 = pGVar2->numVertices;
      }
    }
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE (or not, wdgl can't render)
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geo->instData = header;
	header->platform = PLATFORM_WDGL;
	header->vbo = 0;
	header->ibo = 0;
	header->numAttribs =
		pipe->numCustomAttribs + 1 + (geo->numTexCoordSets > 0);
	if(geo->flags & Geometry::PRELIT)
		header->numAttribs++;
	if(geo->flags & Geometry::NORMALS)
		header->numAttribs++;
	int32 offset = 0;
	header->attribs = rwNewT(AttribDesc, header->numAttribs, MEMDUR_EVENT | ID_GEOMETRY);

	AttribDesc *a = header->attribs;
	// Vertices
	a->index = 0;
	a->type = 0;
	a->normalized = 0;
	a->size = 3;
	a->offset = offset;
	offset += 12;
	a++;
	int32 firstCustom = 1;

	// texCoords, only one set here
	if(geo->numTexCoordSets){
		a->index = 1;
		a->type = 3;
		a->normalized = 0;
		a->size = 2;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::NORMALS){
		a->index = 2;
		a->type = 1;
		a->normalized = 1;
		a->size = 3;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::PRELIT){
		a->index = 3;
		a->type = 2;
		a->normalized = 1;
		a->size = 4;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(pipe->instanceCB)
		offset += pipe->instanceCB(geo, firstCustom, offset);
	else{
		header->dataSize = offset*geo->numVertices;
		header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	}

	a = header->attribs;
	for(int32 i = 0; i < header->numAttribs; i++)
		a[i].stride = offset;

	uint8 *p = header->data + a->offset;
	V3d *vert = geo->morphTargets->vertices;
	for(int32 i = 0; i < geo->numVertices; i++){
		packattrib(p, (float32*)vert, a);
		vert++;
		p += a->stride;
	}
	a++;

	if(geo->numTexCoordSets){
		p = header->data + a->offset;
		TexCoords *texcoord = geo->texCoords[0];
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)texcoord, a, 512.0f);
			texcoord++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::NORMALS){
		p = header->data + a->offset;
		V3d *norm = geo->morphTargets->normals;
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)norm, a);
			norm++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::PRELIT){
		// TODO: this seems too complicated
		p = header->data + a->offset;
		RGBA *color = geo->colors;
		float32 f[4];
		for(int32 i = 0; i < geo->numVertices; i++){
			f[0] = color->red/255.0f;
			f[1] = color->green/255.0f;
			f[2] = color->blue/255.0f;
			f[3] = color->alpha/255.0f;
			packattrib(p, (float32*)f, a);
			color++;
			p += a->stride;
		}
		a++;
	}
}